

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

void __thiscall
CConnman::CConnman(CConnman *this,uint64_t nSeed0In,uint64_t nSeed1In,AddrMan *addrman_in,
                  NetGroupManager *netgroupman,CChainParams *params,bool network_active)

{
  _Rb_tree_header *p_Var1;
  long in_FS_OFFSET;
  Options connOptions;
  Options local_148;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->nTotalBytesSent = 0;
  this->nMaxOutboundTotalBytesSentInCycle = 0;
  (this->m_total_bytes_sent_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->nTotalBytesRecv).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)
   ((long)&(this->m_total_bytes_sent_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_total_bytes_sent_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_total_bytes_sent_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->m_total_bytes_sent_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  (this->nMaxOutboundCycleStartTime).__r = 0;
  (this->vWhitelistedRangeIncoming).
  super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vWhitelistedRangeIncoming).
  super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vWhitelistedRangeIncoming).
  super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vWhitelistedRangeOutgoing).
  super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vWhitelistedRangeOutgoing).
  super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vWhitelistedRangeOutgoing).
  super__Vector_base<NetWhitelistPermissions,_std::allocator<NetWhitelistPermissions>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nSendBufferMaxSize = 0;
  this->nReceiveFloodSize = 0;
  (this->vhListenSocket).
  super__Vector_base<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vhListenSocket).
  super__Vector_base<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vhListenSocket).
  super__Vector_base<CConnman::ListenSocket,_std::allocator<CConnman::ListenSocket>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->fNetworkActive = (__atomic_base<bool>)0x1;
  this->fAddressesInitialized = false;
  this->addrman = addrman_in;
  this->m_netgroupman = netgroupman;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Deque_base(&(this->m_addr_fetches).
                 super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
  (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_added_nodes_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->m_added_nodes_mutex).super_mutex.super___mutex_base._M_mutex + 0x10)
       = 0;
  (this->m_added_nodes_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_added_nodes_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_added_nodes_mutex).super_mutex.super___mutex_base._M_mutex + 8) =
       0;
  (this->m_added_node_params).super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_added_node_params).super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_addr_fetches_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_added_node_params).super__Vector_base<AddedNodeParams,_std::allocator<AddedNodeParams>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_addr_fetches_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_addr_fetches_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_addr_fetches_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_addr_fetches_mutex).super_mutex.super___mutex_base._M_mutex + 8) =
       0;
  (this->m_nodes_disconnected).super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->m_nodes_disconnected;
  (this->m_nodes_disconnected).super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->m_nodes_disconnected;
  *(undefined8 *)
   ((long)&(this->m_nodes_mutex).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)
   ((long)&(this->m_nodes_mutex).super_recursive_mutex.super___recursive_mutex_base._M_mutex + 0x10)
       = 0;
  (this->m_nodes_disconnected).super__List_base<CNode_*,_std::allocator<CNode_*>_>._M_impl._M_node.
  _M_size = 0;
  (this->m_nodes_mutex).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__align = 0;
  (this->m_nodes_mutex).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __prev = (__pthread_internal_list *)0x0;
  (this->m_nodes_mutex).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__list.
  __next = (__pthread_internal_list *)0x0;
  (this->m_nodes_mutex).super_recursive_mutex.super___recursive_mutex_base._M_mutex.__data.__kind =
       1;
  (this->m_addr_response_caches)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_addr_response_caches)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  p_Var1 = &(this->m_addr_response_caches)._M_t._M_impl.super__Rb_tree_header;
  (this->nLastNodeId).super___atomic_base<long>._M_i = 0;
  this->nPrevNodeCount = 0;
  (this->m_network_conn_counts)._M_elems[0] = 0;
  (this->m_network_conn_counts)._M_elems[1] = 0;
  (this->m_network_conn_counts)._M_elems[2] = 0;
  (this->m_network_conn_counts)._M_elems[3] = 0;
  (this->m_network_conn_counts)._M_elems[4] = 0;
  (this->m_network_conn_counts)._M_elems[5] = 0;
  (this->m_network_conn_counts)._M_elems[6] = 0;
  (this->m_addr_response_caches)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_addr_response_caches)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_addr_response_caches)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->semOutbound)._M_t.super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
  super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
  super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl = (CSemaphore *)0x0;
  (this->semAddnode)._M_t.super___uniq_ptr_impl<CSemaphore,_std::default_delete<CSemaphore>_>._M_t.
  super__Tuple_impl<0UL,_CSemaphore_*,_std::default_delete<CSemaphore>_>.
  super__Head_base<0UL,_CSemaphore_*,_false>._M_head_impl = (CSemaphore *)0x0;
  this->m_max_addnode = 8;
  this->m_max_feeler = 1;
  (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_anchors).super__Vector_base<CAddress,_std::allocator<CAddress>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->nSeed0 = nSeed0In;
  this->nSeed1 = nSeed1In;
  std::condition_variable::condition_variable(&this->condMsgProc);
  *(undefined8 *)
   ((long)&(this->mutexMsgProc).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev + 1) =
       0;
  *(undefined8 *)
   ((long)&(this->mutexMsgProc).super_mutex.super___mutex_base._M_mutex.__data.__list.__next + 1) =
       0;
  *(undefined8 *)((long)&(this->mutexMsgProc).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->mutexMsgProc).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->mutexMsgProc).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mutexMsgProc).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  CThreadInterrupt::CThreadInterrupt(&this->interruptNet);
  (this->m_onion_binds).super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_onion_binds).super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_onion_binds).super__Vector_base<CService,_std::allocator<CService>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_unused_i2p_sessions_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->m_unused_i2p_sessions_mutex).super_mutex.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->m_unused_i2p_sessions_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_unused_i2p_sessions_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_unused_i2p_sessions_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_i2p_sam_session)._M_t.
  super___uniq_ptr_impl<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>._M_t.
  super__Tuple_impl<0UL,_i2p::sam::Session_*,_std::default_delete<i2p::sam::Session>_>.
  super__Head_base<0UL,_i2p::sam::Session_*,_false>._M_head_impl = (Session *)0x0;
  (this->threadDNSAddressSeed)._M_id._M_thread = 0;
  (this->threadSocketHandler)._M_id._M_thread = 0;
  (this->threadOpenAddedConnections)._M_id._M_thread = 0;
  (this->threadOpenConnections)._M_id._M_thread = 0;
  (this->threadMessageHandler)._M_id._M_thread = 0;
  *(undefined8 *)((long)&(this->threadMessageHandler)._M_id._M_thread + 2) = 0;
  *(undefined8 *)((long)&(this->threadI2PAcceptIncoming)._M_id._M_thread + 2) = 0;
  std::
  queue<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>>
  ::
  queue<std::deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>,void>
            ((queue<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::deque<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>,std::allocator<std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>>>>
              *)&this->m_unused_i2p_sessions);
  *(undefined8 *)
   ((long)&(this->m_reconnections_mutex).super_mutex.super___mutex_base._M_mutex + 0x10) = 0;
  (this->m_reconnections_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->m_reconnections_mutex).super_mutex.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->m_reconnections_mutex).super_mutex.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->m_reconnections_mutex).super_mutex.super___mutex_base._M_mutex + 8)
       = 0;
  (this->m_reconnections).
  super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->m_reconnections;
  (this->m_reconnections).
  super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->m_reconnections;
  (this->m_reconnections).
  super__List_base<CConnman::ReconnectionInfo,_std::allocator<CConnman::ReconnectionInfo>_>._M_impl.
  _M_node._M_size = 0;
  this->m_params = params;
  SetTryNewOutboundPeer(this,false);
  local_148.nLocalServices = NODE_NONE;
  local_148.m_max_automatic_connections = 0;
  local_148.uiInterface = (CClientUIInterface *)0x0;
  local_148.m_msgproc = (NetEventsInterface *)0x0;
  local_148.m_banman = (BanMan *)0x0;
  local_148.nSendBufferMaxSize = 0;
  local_148.nReceiveFloodSize = 0;
  local_148.nMaxOutboundLimit = 0;
  local_148.m_peer_connect_timeout = 0x3c;
  memset(&local_148.vSeedNodes,0,0x90);
  local_148.m_use_addrman_outgoing = true;
  local_148.whitelist_forcerelay = false;
  local_148.whitelist_relay = true;
  local_148.m_specified_outgoing.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.m_specified_outgoing.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.m_specified_outgoing.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148.m_added_nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.m_added_nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.m_added_nodes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Init(this,&local_148);
  SetNetworkActive(this,network_active);
  Options::~Options(&local_148);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CConnman::CConnman(uint64_t nSeed0In, uint64_t nSeed1In, AddrMan& addrman_in,
                   const NetGroupManager& netgroupman, const CChainParams& params, bool network_active)
    : addrman(addrman_in)
    , m_netgroupman{netgroupman}
    , nSeed0(nSeed0In)
    , nSeed1(nSeed1In)
    , m_params(params)
{
    SetTryNewOutboundPeer(false);

    Options connOptions;
    Init(connOptions);
    SetNetworkActive(network_active);
}